

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_mulsu2_i32_s390x
               (TCGContext_conflict12 *tcg_ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
  pTVar1 = tcg_emit_op_s390x(tcg_ctx,INDEX_op_ext_i32_i64);
  pTVar1->args[0] = (TCGArg)ts;
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1 = tcg_emit_op_s390x(tcg_ctx,INDEX_op_extu_i32_i64);
  pTVar1->args[0] = (TCGArg)ts_00;
  pTVar1->args[1] = (TCGArg)(arg2 + (long)tcg_ctx);
  pTVar1 = tcg_emit_op_s390x(tcg_ctx,INDEX_op_mul_i64);
  pTVar1->args[0] = (TCGArg)ts;
  pTVar1->args[1] = (TCGArg)ts;
  pTVar1->args[2] = (TCGArg)ts_00;
  tcg_gen_extr_i64_i32_s390x(tcg_ctx,rl,rh,(TCGv_i64)((long)ts - (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,ts);
  tcg_temp_free_internal_s390x(tcg_ctx,ts_00);
  return;
}

Assistant:

void tcg_gen_mulsu2_i32(TCGContext *tcg_ctx, TCGv_i32 rl, TCGv_i32 rh, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_REG_BITS == 32) {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_mulu2_i32(tcg_ctx, t0, t1, arg1, arg2);
        /* Adjust for negative input for the signed arg1.  */
        tcg_gen_sari_i32(tcg_ctx, t2, arg1, 31);
        tcg_gen_and_i32(tcg_ctx, t2, t2, arg2);
        tcg_gen_sub_i32(tcg_ctx, rh, t1, t2);
        tcg_gen_mov_i32(tcg_ctx, rl, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
        tcg_temp_free_i32(tcg_ctx, t2);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_ext_i32_i64(tcg_ctx, t0, arg1);
        tcg_gen_extu_i32_i64(tcg_ctx, t1, arg2);
        tcg_gen_mul_i64(tcg_ctx, t0, t0, t1);
        tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    }
}